

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detail_method.h
# Opt level: O0

type __thiscall
dukglue::detail::MethodInfo<false,_Circle,_int>::MethodRuntime::actually_call<int>
          (MethodRuntime *this,duk_context *ctx,MethodType method,Circle *obj,tuple<> *args)

{
  int value;
  int return_val;
  tuple<> *args_local;
  Circle *obj_local;
  MethodType method_local;
  duk_context *ctx_local;
  
  value = apply_method<Circle,int>((detail *)ctx,method,obj,args);
  types::DukType<int>::push<int>((duk_context *)this,value);
  return;
}

Assistant:

static typename std::enable_if<!std::is_void<Dummy>::value>::type actually_call(duk_context* ctx, MethodType method, Cls* obj, const std::tuple<BakedTs...>& args)
				{
					// ArgStorage has some static_asserts in it that validate value types,
					// so we typedef it to force ArgStorage<RetType> to compile and run the asserts
					typedef typename dukglue::types::ArgStorage<RetType>::type ValidateReturnType;

					RetType return_val = dukglue::detail::apply_method<Cls, RetType, Ts...>(method, obj, args);

					using namespace dukglue::types;
					DukType<typename Bare<RetType>::type>::template push<RetType>(ctx, std::move(return_val));
				}